

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_dehacked.cpp
# Opt level: O1

PClassActor * __thiscall ADehackedPickup::DetermineType(ADehackedPickup *this)

{
  uint uVar1;
  PClassActor *in_RAX;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  
  iVar3 = 0x23;
  iVar4 = 0;
  do {
    if (iVar3 < iVar4) {
      return (PClassActor *)0x0;
    }
    iVar2 = (iVar3 + iVar4) / 2;
    uVar1 = *(uint *)DehSpriteMappings[iVar2].Sprite;
    uVar5 = sprites.Array[(this->super_AInventory).super_AActor.sprite].field_0.dwName;
    uVar6 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    uVar5 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
    uVar1 = (uint)(uVar6 < uVar5);
    uVar5 = (uint)(uVar6 >= uVar5 && uVar6 != uVar5);
    if (uVar5 == uVar1) {
      in_RAX = PClass::FindActor(DehSpriteMappings[iVar2].ClassName);
    }
    else if ((int)(uVar5 - uVar1) < 0) {
      iVar4 = iVar2 + 1;
    }
    else {
      iVar3 = iVar2 + -1;
    }
  } while (uVar5 != uVar1);
  return in_RAX;
}

Assistant:

PClassActor *ADehackedPickup::DetermineType ()
{
	// Look at the actor's current sprite to determine what kind of
	// item to pretend to me.
	int min = 0;
	int max = countof(DehSpriteMappings) - 1;

	while (min <= max)
	{
		int mid = (min + max) / 2;
		int lex = memcmp (DehSpriteMappings[mid].Sprite, sprites[sprite].name, 4);
		if (lex == 0)
		{
			return PClass::FindActor(DehSpriteMappings[mid].ClassName);
		}
		else if (lex < 0)
		{
			min = mid + 1;
		}
		else
		{
			max = mid - 1;
		}
	}
	return NULL;
}